

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

Promise<void> __thiscall
capnp::Capability::Server::internalUnimplemented
          (Server *this,char *interfaceName,uint64_t typeId,uint16_t methodId)

{
  char *pcVar1;
  size_t sVar2;
  undefined6 in_register_0000000a;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar3;
  Promise<void> PVar4;
  unsigned_short *in_stack_fffffffffffffe38;
  undefined1 local_1ba [2];
  String local_1b8;
  _func_int **local_198;
  ClientHook *pCStack_190;
  char *local_180;
  uint64_t local_178;
  Exception local_170;
  
  local_180 = (char *)CONCAT62(in_register_0000000a,methodId);
  local_178 = typeId;
  kj::_::Debug::makeDescription<char_const(&)[24],char_const*&,unsigned_long&,unsigned_short&>
            (&local_1b8,(Debug *)"\"Method not implemented.\", interfaceName, typeId, methodId",
             "Method not implemented.",(char (*) [24])&local_178,&local_180,
             (unsigned_long *)local_1ba,in_stack_fffffffffffffe38);
  kj::Exception::Exception
            (&local_170,UNIMPLEMENTED,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++"
             ,0x50,&local_1b8);
  kj::heap<kj::_::ImmediateBrokenPromiseNode,kj::Exception>((kj *)&local_198,&local_170);
  this->_vptr_Server = local_198;
  this->thisHook = pCStack_190;
  kj::Exception::~Exception(&local_170);
  sVar2 = local_1b8.content.size_;
  pcVar1 = local_1b8.content.ptr;
  pPVar3 = extraout_RDX;
  if (local_1b8.content.ptr != (char *)0x0) {
    local_1b8.content.ptr = (char *)0x0;
    local_1b8.content.size_ = 0;
    (*(code *)**(undefined8 **)local_1b8.content.disposer)
              (local_1b8.content.disposer,pcVar1,1,sVar2,sVar2,0);
    pPVar3 = extraout_RDX_00;
  }
  PVar4.super_PromiseBase.node.ptr = pPVar3;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar4.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> Capability::Server::internalUnimplemented(
    const char* interfaceName, uint64_t typeId, uint16_t methodId) {
  return KJ_EXCEPTION(UNIMPLEMENTED, "Method not implemented.", interfaceName, typeId, methodId);
}